

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader-network.cc
# Opt level: O0

bool tinyusdz::tydra::GetDirectlyBoundMaterial
               (Stage *_stage,Prim *prim,string *purpose,Path *materialPath,Material **material,
               string *err)

{
  bool bVar1;
  ostream *poVar2;
  function<bool_(const_tinyusdz::Stage_&,_const_tinyusdz::MaterialBinding_*)> local_3b8;
  undefined1 auStack_390 [7];
  bool ret;
  anon_class_32_4_30cf10df apply_fun;
  ostringstream local_350 [8];
  ostringstream ss_e_1;
  string local_1d8 [32];
  ostringstream local_1b8 [8];
  ostringstream ss_e;
  Path *local_40;
  string *err_local;
  Material **material_local;
  Path *materialPath_local;
  string *purpose_local;
  Prim *prim_local;
  Stage *_stage_local;
  
  local_40 = (Path *)err;
  err_local = (string *)material;
  material_local = (Material **)materialPath;
  materialPath_local = (Path *)purpose;
  purpose_local = (string *)prim;
  prim_local = (Prim *)_stage;
  if (materialPath == (Path *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream(local_1b8);
    poVar2 = ::std::operator<<((ostream *)local_1b8,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/shader-network.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"GetDirectlyBoundMaterial");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xb4);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_1b8,"`materialPath` ptr is null.");
    ::std::operator<<(poVar2,"\n");
    if (local_40 != (Path *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=((string *)local_40,local_1d8);
      ::std::__cxx11::string::~string(local_1d8);
    }
    _stage_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_1b8);
  }
  else if (material == (Material **)0x0) {
    ::std::__cxx11::ostringstream::ostringstream(local_350);
    poVar2 = ::std::operator<<((ostream *)local_350,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/shader-network.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"GetDirectlyBoundMaterial");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xb8);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_350,"`material` ptr is null.");
    ::std::operator<<(poVar2,"\n");
    if (local_40 != (Path *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=((string *)local_40,(string *)&apply_fun.material);
      ::std::__cxx11::string::~string((string *)&apply_fun.material);
    }
    _stage_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_350);
  }
  else {
    apply_fun.purpose = (string *)&material_local;
    apply_fun.materialPath = &local_40;
    apply_fun.err = &err_local;
    _auStack_390 = purpose;
    ::std::function<bool(tinyusdz::Stage_const&,tinyusdz::MaterialBinding_const*)>::
    function<tinyusdz::tydra::GetDirectlyBoundMaterial(tinyusdz::Stage_const&,tinyusdz::Prim_const&,std::__cxx11::string_const&,tinyusdz::Path*,tinyusdz::Material_const**,std::__cxx11::string*)::__0&,void>
              ((function<bool(tinyusdz::Stage_const&,tinyusdz::MaterialBinding_const*)> *)&local_3b8
               ,(anon_class_32_4_30cf10df *)auStack_390);
    bVar1 = ApplyToMaterialBinding(_stage,prim,&local_3b8);
    ::std::function<bool_(const_tinyusdz::Stage_&,_const_tinyusdz::MaterialBinding_*)>::~function
              (&local_3b8);
    _stage_local._7_1_ = bVar1;
  }
  return (bool)(_stage_local._7_1_ & 1);
}

Assistant:

bool GetDirectlyBoundMaterial(
  const Stage &_stage,
  const Prim &prim,
  const std::string &purpose,
  tinyusdz::Path *materialPath,
  const Material **material,
  std::string *err) {

  if (!materialPath) {
    PUSH_ERROR_AND_RETURN("`materialPath` ptr is null.");
  }

  if (!material) {
    PUSH_ERROR_AND_RETURN("`material` ptr is null.");
  }

  auto apply_fun = [&](const Stage &stage, const MaterialBinding *mb) -> bool {

    Relationship mat_rel;
    if (!mb->get_materialBinding(value::token(purpose), &mat_rel)) {
      return false;
    }

    if (!GetSinglePath(mat_rel, materialPath)) {
      std::string binding_name = kMaterialBinding;
      if (!purpose.empty()) {
        binding_name += ":" + purpose;
      }
      PUSH_ERROR_AND_RETURN(fmt::format("`{}` must be single targetPath", binding_name));
    }

    const Prim *p{nullptr};
    if (stage.find_prim_at_path(*materialPath, p, err)) {
      if (p->is<Material>()) {
        (*material) = p->as<Material>();
        return true;
      } else {
        (*material) = nullptr;
      }
    }

    return false;
  };

  bool ret = ApplyToMaterialBinding(_stage, prim, apply_fun);

  return ret;
}